

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QMessagePattern::BacktraceParams>::copyAppend
          (QGenericArrayOps<QMessagePattern::BacktraceParams> *this,BacktraceParams *b,
          BacktraceParams *e)

{
  qsizetype *pqVar1;
  BacktraceParams *pBVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    pBVar2 = (this->super_QArrayDataPointer<QMessagePattern::BacktraceParams>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QMessagePattern::BacktraceParams>).size;
      pDVar4 = (b->backtraceSeparator).d.d;
      pBVar2[lVar3].backtraceSeparator.d.d = pDVar4;
      pBVar2[lVar3].backtraceSeparator.d.ptr = (b->backtraceSeparator).d.ptr;
      pBVar2[lVar3].backtraceSeparator.d.size = (b->backtraceSeparator).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pBVar2[lVar3].backtraceDepth = b->backtraceDepth;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QMessagePattern::BacktraceParams>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }